

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xml_parse_result * __thiscall
pugi::xml_document::load
          (xml_parse_result *__return_storage_ptr__,xml_document *this,
          basic_istream<char,_std::char_traits<char>_> *stream,uint options,xml_encoding encoding)

{
  size_t *psVar1;
  ulong uVar2;
  xml_stream_chunk<char> *pxVar3;
  uint uVar4;
  xml_encoding encoding_00;
  long lVar5;
  long lVar6;
  xml_stream_chunk<char> *pxVar7;
  ulong uVar8;
  xml_stream_chunk<char> *pxVar9;
  void *result;
  size_t size;
  xml_parse_status xVar10;
  xml_stream_chunk<char> *pxVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  auto_deleter<pugi::impl::(anonymous_namespace)::xml_stream_chunk<char>_> local_60;
  xml_encoding local_50;
  uint local_4c;
  xml_document_struct *local_48;
  xml_document *local_40;
  xml_parse_result *local_38;
  
  reset(this);
  if (((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 5) != 0) {
    __return_storage_ptr__->encoding = encoding_auto;
    __return_storage_ptr__->status = status_io_error;
    goto LAB_00153fe6;
  }
  local_48 = (xml_document_struct *)(this->super_xml_node)._root;
  local_50 = encoding;
  local_4c = options;
  local_40 = this;
  lVar5 = std::istream::tellg();
  if (lVar5 < 0) {
    pxVar9 = (xml_stream_chunk<char> *)0x0;
    local_38 = __return_storage_ptr__;
    std::ios::clear((int)*(undefined8 *)(*(long *)stream + -0x18) + (int)stream);
    local_60.deleter = impl::anon_unknown_0::xml_stream_chunk<char>::destroy;
    uVar4 = *(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20);
    size = 0;
    pxVar11 = (xml_stream_chunk<char> *)0x0;
    do {
      if ((uVar4 & 2) != 0) {
        local_60.data = pxVar9;
        pxVar7 = (xml_stream_chunk<char> *)
                 (*(code *)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>
                           ::allocate)(size + 1);
        pxVar11 = pxVar7;
        if (pxVar7 != (xml_stream_chunk<char> *)0x0) goto LAB_00153f72;
        xVar10 = status_out_of_memory;
        goto LAB_00153f9e;
      }
      pxVar7 = (xml_stream_chunk<char> *)
               (*(code *)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::
                         allocate)(0x7fe8);
      if (pxVar7 == (xml_stream_chunk<char> *)0x0) break;
      pxVar7->next = (xml_stream_chunk<char> *)0x0;
      pxVar7->size = 0;
      pxVar3 = pxVar7;
      if (pxVar11 != (xml_stream_chunk<char> *)0x0) {
        pxVar11->next = pxVar7;
        pxVar3 = pxVar9;
      }
      pxVar9 = pxVar3;
      std::istream::read((char *)stream,(long)pxVar7->data);
      uVar2 = *(ulong *)(stream + 8);
      pxVar7->size = uVar2;
      uVar4 = *(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20);
      if (((uVar4 & 1) != 0) || ((uVar4 & 6) == 4)) {
        xVar10 = status_io_error;
        local_60.data = pxVar9;
        goto LAB_00153f9e;
      }
      uVar8 = uVar2 + size;
      if (uVar2 + size <= size) {
        uVar8 = size;
      }
      bVar12 = CARRY8(uVar2,size);
      size = uVar8;
      pxVar11 = pxVar7;
    } while (!bVar12);
    xVar10 = status_out_of_memory;
    local_60.data = pxVar9;
LAB_00153f9e:
    size = 0;
    pxVar7 = (xml_stream_chunk<char> *)0x0;
    goto LAB_00153fa4;
  }
  auVar13 = std::istream::tellg();
  lVar5 = auVar13._0_8_;
  xVar10 = status_io_error;
  std::istream::seekg((long)stream,_S_beg);
  lVar6 = std::istream::tellg();
  std::istream::seekg(stream,lVar5,auVar13._8_8_);
  if (-1 < lVar5 && ((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 5) == 0) {
    if (-1 < lVar6 - lVar5) {
      pxVar7 = (xml_stream_chunk<char> *)
               (*(code *)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::
                         allocate)((lVar6 - lVar5) + 1);
      local_60.deleter =
           (D)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate;
      local_60.data = pxVar7;
      if (pxVar7 == (xml_stream_chunk<char> *)0x0) {
        xVar10 = status_out_of_memory;
LAB_00153fb7:
        size = 0;
        pxVar7 = (xml_stream_chunk<char> *)0x0;
      }
      else {
        std::istream::read((char *)stream,(long)pxVar7);
        xVar10 = status_ok;
        if ((*(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20) & 6) == 4 ||
            (*(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20) & 1) != 0) {
          xVar10 = status_io_error;
          goto LAB_00153fb7;
        }
        size = *(size_t *)(stream + 8);
        local_60.data = (xml_stream_chunk<char> *)0x0;
      }
      impl::anon_unknown_0::auto_deleter<void>::~auto_deleter((auto_deleter<void> *)&local_60);
      goto LAB_00153fda;
    }
    xVar10 = status_out_of_memory;
  }
  goto LAB_00153fdf;
LAB_00153f72:
  for (; pxVar9 != (xml_stream_chunk<char> *)0x0; pxVar9 = pxVar9->next) {
    memcpy(pxVar11,pxVar9->data,pxVar9->size);
    psVar1 = &pxVar9->size;
    pxVar11 = (xml_stream_chunk<char> *)(pxVar11->data + (*psVar1 - 0x10));
  }
  xVar10 = status_ok;
LAB_00153fa4:
  impl::anon_unknown_0::auto_deleter<pugi::impl::(anonymous_namespace)::xml_stream_chunk<char>_>::
  ~auto_deleter(&local_60);
  __return_storage_ptr__ = local_38;
LAB_00153fda:
  if (xVar10 == status_ok) {
    local_40 = (xml_document *)&local_40->_buffer;
    encoding_00 = impl::anon_unknown_0::get_buffer_encoding(local_50,pxVar7,size);
    if (encoding_00 == encoding_utf8) {
      pxVar7->data[size - 0x10] = '\0';
      size = size + 1;
    }
    impl::anon_unknown_0::load_buffer_impl
              (__return_storage_ptr__,local_48,&local_48->super_xml_node_struct,pxVar7,size,local_4c
               ,encoding_00,true,true,(char_t **)local_40);
    return __return_storage_ptr__;
  }
LAB_00153fdf:
  __return_storage_ptr__->encoding = encoding_auto;
  __return_storage_ptr__->status = xVar10;
LAB_00153fe6:
  __return_storage_ptr__->offset = 0;
  return __return_storage_ptr__;
}

Assistant:

PUGI_IMPL_FN xml_parse_result xml_document::load(std::basic_istream<char>& stream, unsigned int options, xml_encoding encoding)
	{
		reset();

		return impl::load_stream_impl(static_cast<impl::xml_document_struct*>(_root), stream, options, encoding, &_buffer);
	}